

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

bool __thiscall
cfd::TransactionContext::IsFindTxOut
          (TransactionContext *this,Script *locking_script,uint32_t *index,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indexes)

{
  iterator __position;
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  uint32_t uVar4;
  pointer puVar5;
  bool bVar6;
  uint local_6c;
  Script local_68;
  
  if (indexes == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    uVar4 = (**(code **)(*(long *)this + 0x18))(this,locking_script);
    bVar6 = true;
    if (index != (uint32_t *)0x0) {
      *index = uVar4;
    }
  }
  else {
    local_6c = 0;
    if ((int)((ulong)(*(long *)&this->field_0x30 - *(long *)&this->field_0x28) >> 4) * -0x33333333
        != 0) {
      do {
        cfd::core::AbstractTxOut::GetLockingScript();
        cVar3 = cfd::core::Script::Equals(locking_script);
        core::Script::~Script(&local_68);
        if (cVar3 != '\0') {
          __position._M_current =
               (indexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (indexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)indexes,__position,
                       &local_6c);
          }
          else {
            *__position._M_current = local_6c;
            (indexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        local_6c = local_6c + 1;
      } while (local_6c <
               (uint)((int)((ulong)(*(long *)&this->field_0x30 - *(long *)&this->field_0x28) >> 4) *
                     -0x33333333));
    }
    puVar1 = (indexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (indexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = puVar2;
    if ((index != (uint32_t *)0x0) && (puVar5 = puVar1, puVar1 != puVar2)) {
      *index = *puVar1;
      puVar5 = puVar2;
    }
    bVar6 = puVar1 != puVar5;
  }
  return bVar6;
}

Assistant:

bool TransactionContext::IsFindTxOut(
    const Script& locking_script, uint32_t* index,
    std::vector<uint32_t>* indexes) const {
  if (indexes != nullptr) {
    for (uint32_t idx = 0; idx < static_cast<uint32_t>(vout_.size()); ++idx) {
      if (locking_script.Equals(vout_[idx].GetLockingScript())) {
        indexes->emplace_back(idx);
      }
    }
    if ((index != nullptr) && (!indexes->empty())) *index = (*indexes)[0];
    return !indexes->empty();
  }
  try {
    uint32_t temp_index = GetTxOutIndex(locking_script);
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    if (except.GetErrorCode() == CfdError::kCfdIllegalArgumentError) {
      return false;
    } else {
      throw except;
    }
  }
}